

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::FunctionCallArgs(SQCompiler *this,bool rawcall)

{
  SQFuncState *this_00;
  bool bVar1;
  SQInteger arg2;
  SQInteger arg1;
  SQInteger arg0;
  ulong uVar2;
  ulong arg3;
  
  uVar2 = 0xffffffffffffffff;
  while (this->_token != 0x29) {
    Expression(this);
    MoveIfCurrentTargetIsLocal(this);
    if ((this->_token == 0x2c) && (Lex(this), this->_token == 0x29)) {
      Error(this,"expression expected, found \')\'");
    }
    uVar2 = uVar2 + 1;
  }
  Lex(this);
  arg3 = uVar2 + 2;
  if ((rawcall) && (bVar1 = arg3 < 3, arg3 = uVar2, bVar1)) {
    Error(this,"rawcall requires at least 2 parameters (callee and this)");
  }
  uVar2 = 1;
  if (1 < (long)arg3) {
    uVar2 = arg3;
  }
  do {
    arg2 = SQFuncState::PopTarget(this->_fs);
    uVar2 = uVar2 - 1;
  } while (uVar2 != 0);
  arg1 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this_00,-1);
  SQFuncState::AddInstruction(this_00,_OP_CALL,arg0,arg1,arg2,arg3);
  return;
}

Assistant:

void FunctionCallArgs(bool rawcall = false)
    {
        SQInteger nargs = 1;//this
         while(_token != _SC(')')) {
             Expression();
             MoveIfCurrentTargetIsLocal();
             nargs++;
             if(_token == _SC(',')){
                 Lex();
                 if(_token == ')') Error(_SC("expression expected, found ')'"));
             }
         }
         Lex();
         if (rawcall) {
             if (nargs < 3) Error(_SC("rawcall requires at least 2 parameters (callee and this)"));
             nargs -= 2; //removes callee and this from count
         }
         for(SQInteger i = 0; i < (nargs - 1); i++) _fs->PopTarget();
         SQInteger stackbase = _fs->PopTarget();
         SQInteger closure = _fs->PopTarget();
         _fs->AddInstruction(_OP_CALL, _fs->PushTarget(), closure, stackbase, nargs);
    }